

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O3

RC __thiscall PF_BufferMgr::ResizeBuffer(PF_BufferMgr *this,int iNewSize)

{
  PF_BufPageDesc *pPVar1;
  int iVar2;
  int iVar3;
  RC RVar4;
  PF_BufPageDesc *pPVar5;
  void *__s;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int newSlot;
  int local_3c;
  ulong local_38;
  
  ClearBuffer(this);
  local_38 = (long)iNewSize << 5;
  uVar8 = 0xffffffffffffffff;
  if (-1 < iNewSize) {
    uVar8 = local_38;
  }
  pPVar5 = (PF_BufPageDesc *)operator_new__(uVar8);
  if (0 < iNewSize) {
    iVar9 = this->pageSize;
    iVar7 = -1;
    iVar3 = -1;
    if (-1 < iVar9) {
      iVar3 = iVar9;
    }
    lVar6 = 0;
    do {
      __s = operator_new__((long)iVar3);
      *(void **)((long)&pPVar5->pData + lVar6) = __s;
      memset(__s,0,(long)iVar9);
      *(int *)((long)&pPVar5->prev + lVar6) = iVar7;
      *(int *)((long)&pPVar5->next + lVar6) = iVar7 + 2;
      iVar7 = iVar7 + 1;
      lVar6 = lVar6 + 0x20;
    } while ((ulong)(uint)iNewSize << 5 != lVar6);
  }
  *(undefined4 *)((long)pPVar5 + (local_38 - 0x18)) = 0xffffffff;
  pPVar5->prev = -1;
  iVar9 = this->first;
  pPVar1 = this->bufTable;
  this->numPages = iNewSize;
  this->last = -1;
  this->free = 0;
  this->first = -1;
  this->bufTable = pPVar5;
  iVar3 = iVar9;
  while (iVar3 != -1) {
    iVar7 = pPVar1[iVar3].next;
    RVar4 = PF_HashTable::Delete(&this->hashTable,pPVar1[iVar3].fd,pPVar1[iVar3].pageNum);
    iVar3 = iVar7;
    if (RVar4 != 0) {
      return RVar4;
    }
  }
  if (iVar9 == -1) {
    if (pPVar1 == (PF_BufPageDesc *)0x0) {
      return 0;
    }
  }
  else {
    do {
      iVar3 = pPVar1[iVar9].next;
      RVar4 = InternalAlloc(this,&local_3c);
      iVar7 = local_3c;
      if (RVar4 != 0) {
        return RVar4;
      }
      RVar4 = PF_HashTable::Insert(&this->hashTable,pPVar1[iVar9].fd,pPVar1[iVar9].pageNum,local_3c)
      ;
      if (RVar4 != 0) {
        return RVar4;
      }
      lVar6 = (long)iVar7;
      pPVar5 = this->bufTable;
      iVar2 = pPVar1[iVar9].fd;
      pPVar5[lVar6].pageNum = pPVar1[iVar9].pageNum;
      pPVar5[lVar6].fd = iVar2;
      pPVar5[lVar6].bDirty = 0;
      pPVar5[lVar6].pinCount = 1;
      Unlink(this,iVar7);
      this->bufTable[lVar6].next = this->free;
      this->free = iVar7;
      iVar9 = iVar3;
    } while (iVar3 != -1);
  }
  operator_delete__(pPVar1);
  return 0;
}

Assistant:

RC PF_BufferMgr::ResizeBuffer(int iNewSize)
{
   int i;
   RC rc;

   // First try and clear out the old buffer!
   ClearBuffer();

   // Allocate memory for a new buffer table
   PF_BufPageDesc *pNewBufTable = new PF_BufPageDesc[iNewSize];

   // Initialize the new buffer table and allocate memory for buffer
   // pages.  Initially, the free list contains all pages
   for (i = 0; i < iNewSize; i++) {
      if ((pNewBufTable[i].pData = new char[pageSize]) == NULL) {
         cerr << "Not enough memory for buffer\n";
         exit(1);
      }

      memset ((void *)pNewBufTable[i].pData, 0, pageSize);

      pNewBufTable[i].prev = i - 1;
      pNewBufTable[i].next = i + 1;
   }
   pNewBufTable[0].prev = pNewBufTable[iNewSize - 1].next = INVALID_SLOT;

   // Now we must remember the old first and last slots and (of course)
   // the buffer table itself.  Then we use insert methods to insert
   // each of the entries into the new buffertable
   int oldFirst = first;
   PF_BufPageDesc *pOldBufTable = bufTable;

   // Setup the new number of pages,  first, last and free
   numPages = iNewSize;
   first = last = INVALID_SLOT;
   free = 0;

   // Setup the new buffer table
   bufTable = pNewBufTable;

   // We must first remove from the hashtable any possible entries
   int slot, next, newSlot;
   slot = oldFirst;
   while (slot != INVALID_SLOT) {
      next = pOldBufTable[slot].next;

      // Must remove the entry from the hashtable from the
      if ((rc=hashTable.Delete(pOldBufTable[slot].fd, pOldBufTable[slot].pageNum)))
         return (rc);
      slot = next;
   }

   // Now we traverse through the old buffer table and copy any old
   // entries into the new one
   slot = oldFirst;
   while (slot != INVALID_SLOT) {

      next = pOldBufTable[slot].next;
      // Allocate a new slot for the old page
      if ((rc = InternalAlloc(newSlot)))
         return (rc);

      // Insert the page into the hash table,
      // and initialize the page description entry
      if ((rc = hashTable.Insert(pOldBufTable[slot].fd,
            pOldBufTable[slot].pageNum, newSlot)) ||
            (rc = InitPageDesc(pOldBufTable[slot].fd,
            pOldBufTable[slot].pageNum, newSlot)))
         return (rc);

      // Put the slot back on the free list before returning the error
      Unlink(newSlot);
      InsertFree(newSlot);

      slot = next;
   }

   // Finally, delete the old buffer table
   delete [] pOldBufTable;

   return 0;
}